

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

int rsa1_loadpub_f(Filename *filename,BinarySink *bs,char **commentptr,char **errorstr)

{
  int iVar1;
  LoadedFile *lf;
  
  lf = lf_load_keyfile(filename,errorstr);
  if (lf == (LoadedFile *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = rsa1_loadpub_s(lf->binarysource_,bs,commentptr,errorstr);
    lf_free(lf);
  }
  return iVar1;
}

Assistant:

int rsa1_loadpub_f(const Filename *filename, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errorstr);
    if (!lf)
        return 0;

    int toret = rsa1_loadpub_s(BinarySource_UPCAST(lf), bs,
                               commentptr, errorstr);
    lf_free(lf);
    return toret;
}